

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_medium.c
# Opt level: O0

block_state deflate_medium(deflate_state *s,int flush)

{
  bool bVar1;
  uint16_t uVar2;
  Pos cur_match;
  uint32_t uVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  uchar *local_88;
  uchar *local_78;
  uint local_64;
  uchar *local_60;
  int64_t dist;
  ushort local_36;
  int bflush;
  uint16_t uStack_30;
  Pos hash_head;
  int early_exit;
  match next_match;
  match current_match;
  int flush_local;
  deflate_state *s_local;
  
  bVar1 = s->level < 5;
  memset(&next_match,0,8);
  memset(&stack0xffffffffffffffd0,0,8);
  do {
    if (s->lookahead < 0x106) {
      fill_window(s);
      if ((s->lookahead < 0x106) && (flush == 0)) {
        return need_more;
      }
      if (s->lookahead == 0) {
        if (s->strstart < 2) {
          local_64 = s->strstart;
        }
        else {
          local_64 = 2;
        }
        s->insert = local_64;
        if (flush == 4) {
          if (s->block_start < 0) {
            local_78 = (uchar *)0x0;
          }
          else {
            local_78 = s->window + (uint)s->block_start;
          }
          zng_tr_flush_block(s,(char *)local_78,s->strstart - s->block_start,1);
          s->block_start = s->strstart;
          flush_pending(s->strm);
          if (s->strm->avail_out == 0) {
            return finish_started;
          }
          return finish_done;
        }
        if (s->sym_next != 0) {
          if (s->block_start < 0) {
            local_88 = (uchar *)0x0;
          }
          else {
            local_88 = s->window + (uint)s->block_start;
          }
          zng_tr_flush_block(s,(char *)local_88,s->strstart - s->block_start,0);
          s->block_start = s->strstart;
          flush_pending(s->strm);
          if (s->strm->avail_out == 0) {
            return need_more;
          }
        }
        return block_done;
      }
      hash_head = 0;
    }
    if ((bVar1) || (hash_head == 0)) {
      local_36 = 0;
      if (3 < s->lookahead) {
        local_36 = quick_insert_string(s,s->strstart);
      }
      uVar2 = (uint16_t)s->strstart;
      next_match.strstart = uVar2;
      next_match.orgstart = uVar2;
      lVar5 = (ulong)s->strstart - (ulong)local_36;
      if ((((long)(ulong)(s->w_size - 0x106) < lVar5) || (lVar5 < 1)) || (local_36 == 0)) {
        next_match.match_start = 0;
        next_match.match_length = 1;
      }
      else {
        uVar3 = longest_match_unaligned_16(s,local_36);
        next_match.match_length = (ushort)uVar3;
        next_match.match_start = (uint16_t)s->match_start;
        if ((ushort)uVar3 < 4) {
          next_match.match_length = 1;
        }
        if (next_match.strstart <= next_match.match_start) {
          next_match.match_length = 1;
        }
      }
    }
    else {
      next_match.match_length = hash_head;
      next_match.match_start = uStack_30;
      next_match.strstart = (ushort)early_exit;
      next_match.orgstart = early_exit._2_2_;
      hash_head = 0;
    }
    insert_match(s,next_match);
    bVar6 = false;
    if ((!bVar1) && (bVar6 = false, 0x106 < s->lookahead)) {
      bVar6 = (uint)next_match.strstart + (uint)next_match.match_length < s->window_size - 0x106;
    }
    if (bVar6) {
      s->strstart = (uint)next_match.strstart + (uint)next_match.match_length;
      cur_match = quick_insert_string(s,s->strstart);
      early_exit._0_2_ = (ushort)s->strstart;
      lVar5 = (ulong)s->strstart - (ulong)cur_match;
      early_exit._2_2_ = (ushort)early_exit;
      if ((((long)(ulong)(s->w_size - 0x106) < lVar5) || (lVar5 < 1)) || (cur_match == 0)) {
        uStack_30 = 0;
        hash_head = 1;
      }
      else {
        uVar3 = longest_match_unaligned_16(s,cur_match);
        hash_head = (Pos)uVar3;
        uStack_30 = (uint16_t)s->match_start;
        if ((uint)(ushort)early_exit <= (s->match_start & 0xffff)) {
          hash_head = 1;
        }
        if (hash_head < 4) {
          hash_head = 1;
        }
        else {
          fizzle_matches(s,&next_match,(match *)&stack0xffffffffffffffd0);
        }
      }
      s->strstart = (uint)next_match.strstart;
    }
    else {
      hash_head = 0;
    }
    iVar4 = emit_match(s,next_match);
    s->strstart = (uint)next_match.match_length + s->strstart;
    if (iVar4 != 0) {
      if (s->block_start < 0) {
        local_60 = (uchar *)0x0;
      }
      else {
        local_60 = s->window + (uint)s->block_start;
      }
      zng_tr_flush_block(s,(char *)local_60,s->strstart - s->block_start,0);
      s->block_start = s->strstart;
      flush_pending(s->strm);
      if (s->strm->avail_out == 0) {
        return need_more;
      }
    }
  } while( true );
}

Assistant:

Z_INTERNAL block_state deflate_medium(deflate_state *s, int flush) {
    /* Align the first struct to start on a new cacheline, this allows us to fit both structs in one cacheline */
    ALIGNED_(16) struct match current_match;
                 struct match next_match;

    /* For levels below 5, don't check the next position for a better match */
    int early_exit = s->level < 5;

    memset(&current_match, 0, sizeof(struct match));
    memset(&next_match, 0, sizeof(struct match));

    for (;;) {
        Pos hash_head = 0;    /* head of the hash chain */
        int bflush = 0;       /* set if current block must be flushed */
        int64_t dist;

        /* Make sure that we always have enough lookahead, except
         * at the end of the input file. We need STD_MAX_MATCH bytes
         * for the next match, plus WANT_MIN_MATCH bytes to insert the
         * string following the next current_match.
         */
        if (s->lookahead < MIN_LOOKAHEAD) {
            PREFIX(fill_window)(s);
            if (s->lookahead < MIN_LOOKAHEAD && flush == Z_NO_FLUSH) {
                return need_more;
            }
            if (UNLIKELY(s->lookahead == 0))
                break; /* flush the current block */
            next_match.match_length = 0;
        }

        /* Insert the string window[strstart .. strstart+2] in the
         * dictionary, and set hash_head to the head of the hash chain:
         */

        /* If we already have a future match from a previous round, just use that */
        if (!early_exit && next_match.match_length > 0) {
            current_match = next_match;
            next_match.match_length = 0;
        } else {
            hash_head = 0;
            if (s->lookahead >= WANT_MIN_MATCH) {
                hash_head = quick_insert_string(s, s->strstart);
            }

            current_match.strstart = (uint16_t)s->strstart;
            current_match.orgstart = current_match.strstart;

            /* Find the longest match, discarding those <= prev_length.
             * At this point we have always match_length < WANT_MIN_MATCH
             */

            dist = (int64_t)s->strstart - hash_head;
            if (dist <= MAX_DIST(s) && dist > 0 && hash_head != 0) {
                /* To simplify the code, we prevent matches with the string
                 * of window index 0 (in particular we have to avoid a match
                 * of the string with itself at the start of the input file).
                 */
                current_match.match_length = (uint16_t)FUNCTABLE_CALL(longest_match)(s, hash_head);
                current_match.match_start = (uint16_t)s->match_start;
                if (UNLIKELY(current_match.match_length < WANT_MIN_MATCH))
                    current_match.match_length = 1;
                if (UNLIKELY(current_match.match_start >= current_match.strstart)) {
                    /* this can happen due to some restarts */
                    current_match.match_length = 1;
                }
            } else {
                /* Set up the match to be a 1 byte literal */
                current_match.match_start = 0;
                current_match.match_length = 1;
            }
        }

        insert_match(s, current_match);

        /* now, look ahead one */
        if (LIKELY(!early_exit && s->lookahead > MIN_LOOKAHEAD && (uint32_t)(current_match.strstart + current_match.match_length) < (s->window_size - MIN_LOOKAHEAD))) {
            s->strstart = current_match.strstart + current_match.match_length;
            hash_head = quick_insert_string(s, s->strstart);

            next_match.strstart = (uint16_t)s->strstart;
            next_match.orgstart = next_match.strstart;

            /* Find the longest match, discarding those <= prev_length.
             * At this point we have always match_length < WANT_MIN_MATCH
             */

            dist = (int64_t)s->strstart - hash_head;
            if (dist <= MAX_DIST(s) && dist > 0 && hash_head != 0) {
                /* To simplify the code, we prevent matches with the string
                 * of window index 0 (in particular we have to avoid a match
                 * of the string with itself at the start of the input file).
                 */
                next_match.match_length = (uint16_t)FUNCTABLE_CALL(longest_match)(s, hash_head);
                next_match.match_start = (uint16_t)s->match_start;
                if (UNLIKELY(next_match.match_start >= next_match.strstart)) {
                    /* this can happen due to some restarts */
                    next_match.match_length = 1;
                }
                if (next_match.match_length < WANT_MIN_MATCH)
                    next_match.match_length = 1;
                else
                    fizzle_matches(s, &current_match, &next_match);
            } else {
                /* Set up the match to be a 1 byte literal */
                next_match.match_start = 0;
                next_match.match_length = 1;
            }

            s->strstart = current_match.strstart;
        } else {
            next_match.match_length = 0;
        }

        /* now emit the current match */
        bflush = emit_match(s, current_match);

        /* move the "cursor" forward */
        s->strstart += current_match.match_length;

        if (UNLIKELY(bflush))
            FLUSH_BLOCK(s, 0);
    }
    s->insert = s->strstart < (STD_MIN_MATCH - 1) ? s->strstart : (STD_MIN_MATCH - 1);
    if (flush == Z_FINISH) {
        FLUSH_BLOCK(s, 1);
        return finish_done;
    }
    if (UNLIKELY(s->sym_next))
        FLUSH_BLOCK(s, 0);

    return block_done;
}